

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_traits.cc
# Opt level: O1

void __thiscall
traits_is_copy_or_move_constructible_Test::~traits_is_copy_or_move_constructible_Test
          (traits_is_copy_or_move_constructible_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(traits, is_copy_or_move_constructible) {
    struct A {};

    static_assert(std::is_copy_constructible<A>::value, "");
    static_assert(std::is_move_constructible<A>::value, "");
    static_assert(aux::is_copy_or_move_constructible<A>::value, "");

    struct B {
        B() = default;
        B(B&&) = default;
        B(const B&) = delete;
    };

    static_assert(!std::is_copy_constructible<B>::value, "");
    static_assert(std::is_move_constructible<B>::value, "");
    static_assert(aux::is_copy_or_move_constructible<B>::value, "");

    struct C {
        C() = default;
        C(C&&) = delete;
        C(const C&) = default;
    };

    static_assert(std::is_copy_constructible<C>::value, "");
    static_assert(!std::is_move_constructible<C>::value, "");
    static_assert(aux::is_copy_or_move_constructible<C>::value, "");

    struct D {
        D() = default;
        D(D&&) = delete;
        D(const D&) = delete;
    };

    static_assert(!std::is_copy_constructible<D>::value, "");
    static_assert(!std::is_move_constructible<D>::value, "");
    static_assert(!aux::is_copy_or_move_constructible<D>::value, "");
}